

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  bool bVar1;
  size_type __n;
  reference __x;
  BT<cmSourceFile_*> *v;
  iterator __end1;
  iterator __begin1;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *__range1;
  undefined1 local_38 [8];
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> tmp;
  string *config_local;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_local;
  cmGeneratorTarget *this_local;
  
  tmp.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  GetSourceFilesWithoutObjectLibraries
            ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)local_38,this,
             config);
  __n = std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::size
                  ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)local_38);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve(files,__n);
  __end1 = std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::begin
                     ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)local_38);
  v = (BT<cmSourceFile_*> *)
      std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::end
                ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
                                *)&v);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
          ::operator*(&__end1);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(files,&__x->Value);
    __gnu_cxx::
    __normal_iterator<BT<cmSourceFile_*>_*,_std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector
            ((vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *)local_38);
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::vector<cmSourceFile*>& files, const std::string& config) const
{
  std::vector<BT<cmSourceFile*>> tmp =
    this->GetSourceFilesWithoutObjectLibraries(config);
  files.reserve(tmp.size());
  for (BT<cmSourceFile*>& v : tmp) {
    files.push_back(v.Value);
  }
}